

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

char * idToString(PolicyID id)

{
  if (id < (CMPCOUNT|CMP0001)) {
    return (&PTR_anon_var_dwarf_14e1da_005bb3f0)[id];
  }
  return (char *)0x0;
}

Assistant:

static const char* idToString(cmPolicies::PolicyID id)
{
  switch (id) {
#define POLICY_CASE(ID)                                                       \
  case cmPolicies::ID:                                                        \
    return #ID;
    CM_FOR_EACH_POLICY_ID(POLICY_CASE)
#undef POLICY_CASE
    case cmPolicies::CMPCOUNT:
      return nullptr;
  }
  return nullptr;
}